

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QUrl QFileDialog::getSaveFileUrl
               (QWidget *parent,QString *caption,QUrl *dir,QString *filter,QString *selectedFilter,
               Options options,QStringList *supportedSchemes)

{
  bool bVar1;
  int iVar2;
  QFileDialog *pQVar3;
  QFileDialog *in_RCX;
  QString *in_RDX;
  QString *in_RSI;
  QFileDialogArgs *in_RDI;
  QFileDialog *in_R8;
  QFileDialog *in_R9;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  int execResult;
  QAutoPointer<QFileDialog> dialog;
  QFileDialogArgs args;
  QFileDialog *in_stack_fffffffffffffef8;
  QFileDialogArgs *url;
  QFileDialogArgs *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  AcceptMode in_stack_ffffffffffffff1c;
  QFileDialogArgs *this;
  undefined1 local_70 [8];
  QString aQStack_68 [2];
  QString QStack_30;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_stack_00000008;
  url = in_RDI;
  this = in_RDI;
  memset(local_70,0xaa,0x60);
  QFileDialogArgs::QFileDialogArgs(in_stack_ffffffffffffff10,(QUrl *)url);
  QString::operator=(aQStack_68,in_RDX);
  QString::operator=(&QStack_30,(QString *)in_R8);
  local_18 = 0;
  local_14 = local_c;
  operator_new(0x28);
  QFileDialog(in_R9,(QFileDialogArgs *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
             );
  QAutoPointer<QFileDialog>::QAutoPointer
            ((QAutoPointer<QFileDialog> *)in_RDI,in_stack_fffffffffffffef8);
  QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75acf4);
  setSupportedSchemes((QFileDialog *)in_RDI,(QStringList *)in_stack_fffffffffffffef8);
  QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75ad11);
  setAcceptMode(in_R9,in_stack_ffffffffffffff1c);
  if ((in_R9 != (QFileDialog *)0x0) && (bVar1 = QString::isEmpty((QString *)0x75ad30), !bVar1)) {
    QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75ad41);
    selectNameFilter((QFileDialog *)this,in_RSI);
  }
  pQVar3 = QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75ad5b);
  iVar2 = (**(code **)(*(long *)&(pQVar3->super_QDialog).super_QWidget + 0x1a8))();
  bVar1 = QAutoPointer::operator_cast_to_bool((QAutoPointer<QFileDialog> *)0x75ad78);
  if ((bVar1) && (iVar2 == 1)) {
    if (in_R9 != (QFileDialog *)0x0) {
      QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75ad9d);
      selectedNameFilter(in_RCX);
      QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffef8);
      QString::~QString((QString *)0x75adc3);
    }
    QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75add0);
    selectedUrls(in_R8);
    QList<QUrl>::value((QList<QUrl> *)in_R8,(qsizetype)in_R9);
    QList<QUrl>::~QList((QList<QUrl> *)0x75adfa);
  }
  else {
    QUrl::QUrl((QUrl *)in_RDI);
  }
  QAutoPointer<QFileDialog>::~QAutoPointer((QAutoPointer<QFileDialog> *)in_RDI);
  QFileDialogArgs::~QFileDialogArgs(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QUrl)(QUrlPrivate *)url;
}

Assistant:

QUrl QFileDialog::getSaveFileUrl(QWidget *parent,
                                 const QString &caption,
                                 const QUrl &dir,
                                 const QString &filter,
                                 QString *selectedFilter,
                                 Options options,
                                 const QStringList &supportedSchemes)
{
    QFileDialogArgs args(dir);
    args.parent = parent;
    args.caption = caption;
    args.filter = filter;
    args.mode = AnyFile;
    args.options = options;

    QAutoPointer<QFileDialog> dialog(new QFileDialog(args));
    dialog->setSupportedSchemes(supportedSchemes);
    dialog->setAcceptMode(AcceptSave);
    if (selectedFilter && !selectedFilter->isEmpty())
        dialog->selectNameFilter(*selectedFilter);
    const int execResult = dialog->exec();
    if (bool(dialog) && execResult == QDialog::Accepted) {
        if (selectedFilter)
            *selectedFilter = dialog->selectedNameFilter();
        return dialog->selectedUrls().value(0);
    }
    return QUrl();
}